

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O1

uintptr_t next_target_addr(uintptr_t current,uintptr_t start,uintptr_t end,size_t len,int pattern)

{
  int iVar1;
  size_t sVar2;
  long extraout_RDX;
  
  switch(pattern) {
  case 0:
    current = len + current;
    if (end < current) {
      current = start;
    }
    break;
  case 1:
    current = current + 0x200;
    if (end < current) {
      current = start;
    }
    break;
  case 2:
    break;
  case 3:
    iVar1 = rand();
    current = (ulong)(long)iVar1 % (end - (len + start)) + start & 0xfffffffffffff000;
    break;
  default:
    next_target_addr_cold_1();
    sVar2 = len + 1000000;
    if ((long)start <= (long)len) {
      sVar2 = len;
    }
    return (sVar2 - start) + ((extraout_RDX - current) - (ulong)((long)len < (long)start)) * 1000000
    ;
  }
  return current;
}

Assistant:

uintptr_t next_target_addr(uintptr_t current, uintptr_t start, uintptr_t end,
			   size_t len, int pattern)
{
	/*
	 * @current: current target address
	 * @start: start of region
	 * @end: end of region
	 * @len: dma length
	 * @int: access pattern
	 */

	switch (pattern) {

	case DMA_PATTERN_SEQ:
		return (current + len > end) ? start : current + len;

	case DMA_PATTERN_SEQ512:
		return (current + 512 > end) ? start : current + 512;

	case DMA_PATTERN_FIX:
		return current;

	case DMA_PATTERN_RANDOM:
		return (((rand() % (end - start - len)) + start) >> 12) << 12;

	default:
		pr_err("invalid access pattern\n");
		exit(1);
	}
	
	/* not reached */
	return 0;
}